

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O3

void __thiscall dgPolyhedra::EndFace(dgPolyhedra *this)

{
  long lVar1;
  dgRedBackNode *pdVar2;
  void *__ptr;
  dgTreeNode *pdVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  bool state;
  bool local_71;
  Iterator local_70;
  undefined1 local_60 [40];
  HaI32 local_38;
  
  pdVar3 = (this->super_dgTree<dgEdge,_long>).m_head;
  local_70.m_tree = &this->super_dgTree<dgEdge,_long>;
  if (pdVar3 == (dgTreeNode *)0x0) {
    local_70.m_ptr = (dgRedBackNode *)0x0;
  }
  else {
    local_70.m_ptr = dgRedBackNode::Minimum(&pdVar3->super_dgRedBackNode);
    if (local_70.m_ptr != (dgRedBackNode *)0x0) {
      do {
        if (*(long *)&local_70.m_ptr[1].field_0x20 == 0) {
          pdVar3 = (this->super_dgTree<dgEdge,_long>).m_head;
          if (pdVar3 != (dgTreeNode *)0x0) {
            uVar4 = (ulong)*(uint *)&(local_70.m_ptr[1].m_right)->_vptr_dgRedBackNode << 0x20 |
                    (long)*(int *)&local_70.m_ptr[1]._vptr_dgRedBackNode;
            do {
              lVar6 = 8;
              if ((pdVar3->m_key <= (long)uVar4) && (lVar6 = 0x10, (long)uVar4 <= pdVar3->m_key)) {
                *(dgEdge **)&local_70.m_ptr[1].field_0x20 = &pdVar3->m_info;
                (pdVar3->m_info).m_twin = (dgEdge *)(local_70.m_ptr + 1);
                goto LAB_00859d3b;
              }
              pdVar3 = *(dgTreeNode **)
                        ((long)&(pdVar3->super_dgRedBackNode)._vptr_dgRedBackNode + lVar6);
            } while (pdVar3 != (dgTreeNode *)0x0);
          }
          *(undefined8 *)&local_70.m_ptr[1].field_0x20 = 0;
        }
LAB_00859d3b:
        dgTree<dgEdge,_long>::Iterator::operator++(&local_70,0);
      } while (local_70.m_ptr != (dgRedBackNode *)0x0);
    }
  }
  uVar7 = (this->super_dgTree<dgEdge,_long>).m_count;
  __ptr = malloc((long)(int)(uVar7 * 0x10 + 0x800));
  if ((uVar7 & 0x7fffffff) != 0x7fffff80 && (int)uVar7 < -0x7f) {
    __assert_fail("(entry < m_size) || ((m_size == 0) && (entry == 0))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgStack.h"
                  ,0x60,"T &dgStack<dgEdge *>::operator[](hacd::HaI32) [T = dgEdge *]");
  }
  uVar7 = 0;
  pdVar3 = ((dgTree<dgEdge,_long> *)&(local_70.m_tree)->_vptr_dgTree)->m_head;
  if (pdVar3 == (dgTreeNode *)0x0) {
    local_70.m_ptr = (dgRedBackNode *)0x0;
  }
  else {
    local_70.m_ptr = dgRedBackNode::Minimum(&pdVar3->super_dgRedBackNode);
  }
  if (local_70.m_ptr != (dgRedBackNode *)0x0) {
    uVar7 = 0;
    do {
      pdVar2 = local_70.m_ptr;
      if (*(long *)&local_70.m_ptr[1].field_0x20 == 0) {
        local_60._0_4_ = *(undefined4 *)&(local_70.m_ptr[1].m_right)->_vptr_dgRedBackNode;
        local_60._8_32_ = ZEXT1632(ZEXT816(0) << 0x40);
        local_38 = 0;
        local_60._4_4_ = -1;
        pdVar3 = dgTree<dgEdge,_long>::Insert
                           (&this->super_dgTree<dgEdge,_long>,(dgEdge *)local_60,
                            (ulong)(uint)local_60._0_4_ << 0x20 |
                            (long)*(int *)&local_70.m_ptr[1]._vptr_dgRedBackNode,&local_71);
        if (local_71 == true) {
          __assert_fail("!state",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                        ,0x7ad,"void dgPolyhedra::EndFace()");
        }
        *(dgEdge **)&pdVar2[1].field_0x20 = &pdVar3->m_info;
        (pdVar3->m_info).m_twin = (dgEdge *)(pdVar2 + 1);
        *(undefined8 *)((long)__ptr + (long)(int)uVar7 * 8) = *(undefined8 *)&pdVar2[1].field_0x20;
        uVar7 = uVar7 + 1;
      }
      dgTree<dgEdge,_long>::Iterator::operator++(&local_70,0);
    } while (local_70.m_ptr != (dgRedBackNode *)0x0);
  }
  if (0 < (int)uVar7) {
    uVar4 = 0;
    do {
      lVar6 = *(long *)((long)__ptr + uVar4 * 8);
      lVar5 = lVar6;
      if (*(long *)(lVar6 + 0x18) != 0) {
        __assert_fail("!edge->m_prev",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                      ,0x7b7,"void dgPolyhedra::EndFace()");
      }
      do {
        lVar1 = *(long *)(lVar5 + 0x20);
        lVar5 = *(long *)(lVar1 + 0x10);
      } while (lVar5 != 0);
      uVar4 = uVar4 + 1;
      *(long *)(lVar1 + 0x10) = lVar6;
      *(long *)(lVar6 + 0x18) = lVar1;
    } while (uVar4 != uVar7);
  }
  free(__ptr);
  return;
}

Assistant:

void dgPolyhedra::EndFace ()
{
	dgPolyhedra::Iterator iter (*this);

	// Connect all twin edge
	for (iter.Begin(); iter; iter ++) {
		dgEdge* const edge = &(*iter);
		if (!edge->m_twin) {
			edge->m_twin = FindEdge (edge->m_next->m_incidentVertex, edge->m_incidentVertex);
			if (edge->m_twin) {
				edge->m_twin->m_twin = edge; 
			}
		}
	}

#ifdef __ENABLE_SANITY_CHECK 
	HACD_ASSERT (SanityCheck());
#endif
	dgStack<dgEdge*> edgeArrayPool(GetCount() * 2 + 256);

	hacd::HaI32 edgeCount = 0;
	dgEdge** const edgeArray = &edgeArrayPool[0];
	for (iter.Begin(); iter; iter ++) {
		dgEdge* const edge = &(*iter);
		if (!edge->m_twin) {
			bool state;
			dgPolyhedra::dgPairKey code (edge->m_next->m_incidentVertex, edge->m_incidentVertex);
			dgEdge tmpEdge (edge->m_next->m_incidentVertex, -1);
			tmpEdge.m_incidentFace = -1; 
			dgPolyhedra::dgTreeNode* const node = Insert (tmpEdge, code.GetVal(), state); 
			HACD_ASSERT (!state);
			edge->m_twin = &node->GetInfo();
			edge->m_twin->m_twin = edge; 
			edgeArray[edgeCount] = edge->m_twin;
			edgeCount ++;
		}
	}

	for (hacd::HaI32 i = 0; i < edgeCount; i ++) {
		dgEdge* const edge = edgeArray[i];
		HACD_ASSERT (!edge->m_prev);
		dgEdge *ptr = edge->m_twin;
		for (; ptr->m_next; ptr = ptr->m_next->m_twin){}
		ptr->m_next = edge;
		edge->m_prev = ptr;
	}

#ifdef __ENABLE_SANITY_CHECK 
	HACD_ASSERT (SanityCheck ());
#endif
}